

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddBuildSet(Abc_ZddMan *p,int *pSet,int Size)

{
  int local_24;
  int local_20;
  int Res;
  int i;
  int Size_local;
  int *pSet_local;
  Abc_ZddMan *p_local;
  
  local_24 = 1;
  Vec_IntSelectSort(pSet,Size);
  for (local_20 = Size + -1; -1 < local_20; local_20 = local_20 + -1) {
    local_24 = Abc_ZddUniqueCreate(p,pSet[local_20],local_24,0);
  }
  return local_24;
}

Assistant:

int Abc_ZddBuildSet( Abc_ZddMan * p, int * pSet, int Size )
{
    int i, Res = 1;
    Vec_IntSelectSort( pSet, Size );
    for ( i = Size - 1; i >= 0; i-- )
        Res = Abc_ZddUniqueCreate( p, pSet[i], Res, 0 );
    return Res;
}